

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O2

string * __thiscall
tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  char *__s;
  allocator<char> local_19;
  long local_18;
  
  __s = (char *)(**this)(*(undefined4 *)((long)this + 8));
  if (__s == (char *)0x0) {
    local_18 = (long)*(int *)((long)this + 8);
    Hex<4ul>::toString_abi_cxx11_(__return_storage_ptr__,&local_18);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString (void) const
	{
		const char* name = m_getName(m_value);
		if (name)
			return std::string(name);
		else
			return Hex<NumBytes*2>((deUint64)m_value).toString();
	}